

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void PrintInstruction(InstructionVMGraphContext *ctx,VmInstruction *instruction)

{
  VmValue *pVVar1;
  VmValue *value_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  VmValue **ppVVar6;
  VmInstruction *instruction_00;
  char *pcVar7;
  bool bVar8;
  VmValue *value_2;
  uint i_5;
  VmInstruction *inst;
  VmValue *value_1;
  uint i_4;
  VmValue *edge;
  VmValue *value;
  uint i_3;
  uint local_4c;
  uint i_2;
  uint local_38;
  uint local_34;
  uint i_1;
  uint i;
  uint endOffset;
  uint startOffset;
  char *end;
  char *start;
  VmInstruction *instruction_local;
  InstructionVMGraphContext *ctx_local;
  
  if ((((ctx->showSource & 1U) != 0) && ((instruction->super_VmValue).source != (SynBase *)0x0)) &&
     ((((instruction->super_VmValue).source)->isInternal & 1U) == 0)) {
    _endOffset = (((instruction->super_VmValue).source)->pos).begin;
    end = _endOffset;
    while( true ) {
      bVar8 = false;
      if ((ctx->code < end) && (bVar8 = false, end[-1] != '\r')) {
        bVar8 = end[-1] != '\n';
      }
      if (!bVar8) break;
      end = end + -1;
    }
    do {
      _endOffset = _endOffset + 1;
      bVar8 = false;
      if ((*_endOffset != '\0') && (bVar8 = false, *_endOffset != '\r')) {
        bVar8 = *_endOffset != '\n';
      }
    } while (bVar8);
    iVar2 = (int)end;
    if ((ctx->showAnnotatedSource & 1U) == 0) {
      if (end != ctx->lastStart) {
        Print(ctx,"// %.*s",(ulong)(uint)((int)_endOffset - iVar2),end);
        PrintLine(ctx);
        PrintIndent(ctx);
        ctx->lastStart = end;
      }
    }
    else {
      uVar3 = (int)(((instruction->super_VmValue).source)->pos).begin - iVar2;
      uVar4 = (int)(((instruction->super_VmValue).source)->pos).end - iVar2;
      if (((end != ctx->lastStart) || (uVar3 != ctx->lastStartOffset)) ||
         (uVar4 != ctx->lastEndOffset)) {
        Print(ctx,"// %.*s",(ulong)(uint)((int)_endOffset - iVar2),end);
        PrintLine(ctx);
        PrintIndent(ctx);
        if ((((instruction->super_VmValue).source)->pos).end < _endOffset) {
          Print(ctx,"// ");
          for (local_34 = 0; local_38 = uVar3, local_34 < uVar3; local_34 = local_34 + 1) {
            Print(ctx," ");
            if (end[local_34] == '\t') {
              pcVar7 = "   ";
              if (local_34 == 0) {
                pcVar7 = "  ";
              }
              Print(ctx,pcVar7);
            }
          }
          for (; local_38 < uVar4; local_38 = local_38 + 1) {
            Print(ctx,"~");
            if (end[local_38] == '\t') {
              pcVar7 = "~~~";
              if (local_38 == 0) {
                pcVar7 = "~~";
              }
              Print(ctx,pcVar7);
            }
          }
          PrintLine(ctx);
          PrintIndent(ctx);
        }
        ctx->lastStart = end;
        ctx->lastStartOffset = uVar3;
        ctx->lastEndOffset = uVar4;
      }
    }
  }
  PrintUsers(ctx,&instruction->super_VmValue,false);
  bVar8 = VmType::operator!=(&(instruction->super_VmValue).type,&VmType::Void);
  if (bVar8) {
    if ((ctx->showTypes & 1U) != 0) {
      PrintType(ctx,(instruction->super_VmValue).type);
      Print(ctx," ");
    }
    Print(ctx,"%%%d",(ulong)instruction->uniqueId);
    if (instruction->color != 0) {
      Print(ctx,".c%d",(ulong)instruction->color);
    }
    bVar8 = SmallArray<unsigned_char,_8U>::empty(&instruction->regVmRegisters);
    if (!bVar8) {
      Print(ctx,".r");
      for (local_4c = 0; uVar3 = SmallArray<unsigned_char,_8U>::size(&instruction->regVmRegisters),
          local_4c < uVar3; local_4c = local_4c + 1) {
        pcVar7 = "|%d";
        if (local_4c == 0) {
          pcVar7 = "%d";
        }
        pbVar5 = SmallArray<unsigned_char,_8U>::operator[](&instruction->regVmRegisters,local_4c);
        Print(ctx,pcVar7,(ulong)*pbVar5);
      }
    }
    if (((ctx->showComments & 1U) != 0) &&
       (bVar8 = InplaceStr::empty(&(instruction->super_VmValue).comment), !bVar8)) {
      Print(ctx," (%.*s)",
            (ulong)(uint)((int)(instruction->super_VmValue).comment.end -
                         (int)(instruction->super_VmValue).comment.begin),
            (instruction->super_VmValue).comment.begin);
    }
    if ((ctx->showFullTypes & 1U) != 0) {
      if ((instruction->super_VmValue).type.structType == (TypeBase *)0x0) {
        Print(ctx," <");
        PrintType(ctx,(instruction->super_VmValue).type);
        Print(ctx,">");
      }
      else {
        Print(ctx," <%.*s>",
              (ulong)(uint)((int)(((instruction->super_VmValue).type.structType)->name).end -
                           (int)(((instruction->super_VmValue).type.structType)->name).begin),
              (((instruction->super_VmValue).type.structType)->name).begin);
      }
    }
    Print(ctx," = ");
  }
  pcVar7 = GetInstructionName(instruction);
  Print(ctx,"%s",pcVar7);
  if (instruction->cmd == VM_INST_PHI) {
    Print(ctx," [");
    for (value._4_4_ = 0; uVar3 = SmallArray<VmValue_*,_4U>::size(&instruction->arguments),
        value._4_4_ < uVar3; value._4_4_ = value._4_4_ + 2) {
      ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,value._4_4_);
      pVVar1 = *ppVVar6;
      ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,value._4_4_ + 1);
      value_00 = *ppVVar6;
      if (value._4_4_ != 0) {
        Print(ctx,", ");
      }
      PrintName(ctx,pVVar1,false,false);
      Print(ctx," from ");
      PrintName(ctx,value_00,false,false);
    }
    Print(ctx,"]");
    PrintLine(ctx);
  }
  else if ((ctx->displayAsTree & 1U) == 0) {
    for (value_2._4_4_ = 0; uVar3 = SmallArray<VmValue_*,_4U>::size(&instruction->arguments),
        value_2._4_4_ < uVar3; value_2._4_4_ = value_2._4_4_ + 1) {
      ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,value_2._4_4_);
      pVVar1 = *ppVVar6;
      if (value_2._4_4_ == 0) {
        Print(ctx," ");
      }
      else {
        Print(ctx,", ");
      }
      PrintName(ctx,pVVar1,false,false);
    }
    bVar8 = VmType::operator==(&(instruction->super_VmValue).type,&VmType::Void);
    if (bVar8) {
      Print(ctx," // %%%d",(ulong)instruction->uniqueId);
    }
    PrintLine(ctx);
  }
  else {
    bVar8 = VmType::operator==(&(instruction->super_VmValue).type,&VmType::Void);
    if (bVar8) {
      Print(ctx," // %%%d",(ulong)instruction->uniqueId);
    }
    PrintLine(ctx);
    ctx->depth = ctx->depth + 1;
    for (value_1._4_4_ = 0; uVar3 = SmallArray<VmValue_*,_4U>::size(&instruction->arguments),
        value_1._4_4_ < uVar3; value_1._4_4_ = value_1._4_4_ + 1) {
      ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,value_1._4_4_);
      pVVar1 = *ppVVar6;
      PrintIndent(ctx);
      instruction_00 = getType<VmInstruction>(pVVar1);
      if ((instruction_00 == (VmInstruction *)0x0) ||
         (bVar8 = SmallArray<VmValue_*,_8U>::empty(&(instruction_00->super_VmValue).users), bVar8))
      {
        PrintName(ctx,pVVar1,false,false);
        PrintLine(ctx);
      }
      else {
        PrintInstruction(ctx,instruction_00);
      }
    }
    ctx->depth = ctx->depth - 1;
  }
  return;
}

Assistant:

void PrintInstruction(InstructionVMGraphContext &ctx, VmInstruction *instruction)
{
	if(ctx.showSource && instruction->source && !instruction->source->isInternal)
	{
		const char *start = instruction->source->pos.begin;
		const char *end = start + 1;

		// TODO: handle source locations from imported modules
		while(start > ctx.code && *(start - 1) != '\r' && *(start - 1) != '\n')
			start--;

		while(*end && *end != '\r' && *end != '\n')
			end++;

		if (ctx.showAnnotatedSource)
		{
			unsigned startOffset = unsigned(instruction->source->pos.begin - start);
			unsigned endOffset = unsigned(instruction->source->pos.end - start);

			if(start != ctx.lastStart || startOffset != ctx.lastStartOffset || endOffset != ctx.lastEndOffset)
			{
				Print(ctx, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx);
				PrintIndent(ctx);

				if (instruction->source->pos.end < end)
				{
					Print(ctx, "// ");

					for (unsigned i = 0; i < startOffset; i++)
					{
						Print(ctx, " ");

						if (start[i] == '\t')
							Print(ctx, i == 0 ? "  " : "   ");
					}

					for (unsigned i = startOffset; i < endOffset; i++)
					{
						Print(ctx, "~");

						if (start[i] == '\t')
							Print(ctx, i == 0 ? "~~" : "~~~");
					}

					PrintLine(ctx);
					PrintIndent(ctx);
				}

				ctx.lastStart = start;
				ctx.lastStartOffset = startOffset;
				ctx.lastEndOffset = endOffset;
			}
		}
		else
		{
			if(start != ctx.lastStart)
			{
				Print(ctx, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx);
				PrintIndent(ctx);

				ctx.lastStart = start;
			}
		}
	}

	PrintUsers(ctx, instruction, false);

	if(instruction->type != VmType::Void)
	{
		if(ctx.showTypes)
		{
			PrintType(ctx, instruction->type);
			Print(ctx, " ");
		}

		Print(ctx, "%%%d", instruction->uniqueId);

		if(instruction->color)
			Print(ctx, ".c%d", instruction->color);

		if(!instruction->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", instruction->regVmRegisters[i]);
		}

		if(ctx.showComments && !instruction->comment.empty())
			Print(ctx, " (%.*s)", FMT_ISTR(instruction->comment));

		if (ctx.showFullTypes)
		{
			if (instruction->type.structType)
			{
				Print(ctx, " <%.*s>", FMT_ISTR(instruction->type.structType->name));
			}
			else
			{
				Print(ctx, " <");
				PrintType(ctx, instruction->type);
				Print(ctx, ">");
			}
		}

		Print(ctx, " = ");
	}

	Print(ctx, "%s", GetInstructionName(instruction));

	if(instruction->cmd == VM_INST_PHI)
	{
		Print(ctx, " [");

		for(unsigned i = 0; i < instruction->arguments.size(); i += 2)
		{
			VmValue *value = instruction->arguments[i];
			VmValue *edge = instruction->arguments[i + 1];

			if(i != 0)
				Print(ctx, ", ");

			PrintName(ctx, value, false, false);
			Print(ctx, " from ");
			PrintName(ctx, edge, false, false);
		}

		Print(ctx, "]");
		PrintLine(ctx);

		return;
	}

	if(ctx.displayAsTree)
	{
		if(instruction->type == VmType::Void)
			Print(ctx, " // %%%d", instruction->uniqueId);

		PrintLine(ctx);

		ctx.depth++;

		for(unsigned i = 0; i < instruction->arguments.size(); i++)
		{
			VmValue *value = instruction->arguments[i];

			PrintIndent(ctx);

			VmInstruction *inst = getType<VmInstruction>(value);

			if(inst && !inst->users.empty())
			{
				PrintInstruction(ctx, inst);
			}
			else
			{
				PrintName(ctx, value, false, false);
				PrintLine(ctx);
			}
		}

		ctx.depth--;
	}
	else
	{
		for(unsigned i = 0; i < instruction->arguments.size(); i++)
		{
			VmValue *value = instruction->arguments[i];

			if(i == 0)
				Print(ctx, " ");
			else
				Print(ctx, ", ");

			PrintName(ctx, value, false, false);
		}

		if(instruction->type == VmType::Void)
			Print(ctx, " // %%%d", instruction->uniqueId);

		PrintLine(ctx);
	}
}